

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

void __thiscall restincurl::Worker::Close(Worker *this)

{
  lock_guard<std::mutex> local_18;
  lock_t lock;
  Worker *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->mutex_);
  this->abort_ = true;
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  Signal(this);
  return;
}

Assistant:

void Close() {
            {
                lock_t lock(mutex_);
                abort_ = true;
            }
            Signal();
        }